

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_disconnect_now(ENetPeer *peer,enet_uint32 data)

{
  ENetPeerState EVar1;
  ENetHost *host;
  enet_uint32 eVar2;
  ENetOutgoingCommand *outgoingCommand;
  
  EVar1 = peer->state;
  if (EVar1 == ENET_PEER_STATE_DISCONNECTED) {
    return;
  }
  if ((EVar1 != ENET_PEER_STATE_DISCONNECTING) && (EVar1 != ENET_PEER_STATE_ZOMBIE)) {
    enet_peer_reset_queues(peer);
    outgoingCommand = (ENetOutgoingCommand *)(*callbacks.malloc)(0x60);
    if (outgoingCommand == (ENetOutgoingCommand *)0x0) {
      (*callbacks.no_memory)();
      return;
    }
    *(undefined2 *)&outgoingCommand->command = 0xff44;
    (outgoingCommand->command).disconnect.data =
         data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    outgoingCommand->fragmentOffset = 0;
    outgoingCommand->fragmentLength = 0;
    outgoingCommand->packet = (ENetPacket *)0x0;
    enet_peer_setup_outgoing_command(peer,outgoingCommand);
    host = peer->host;
    eVar2 = enet_time_get();
    host->serviceTime = eVar2;
    enet_protocol_send_outgoing_commands(host,(ENetEvent *)0x0,0);
  }
  enet_peer_reset(peer);
  return;
}

Assistant:

void enet_peer_disconnect_now(ENetPeer *peer, enet_uint32 data) {
        ENetProtocol command;

        if (peer->state == ENET_PEER_STATE_DISCONNECTED) {
            return;
        }

        if (peer->state != ENET_PEER_STATE_ZOMBIE && peer->state != ENET_PEER_STATE_DISCONNECTING) {
            enet_peer_reset_queues(peer);

            command.header.command   = (int)ENET_PROTOCOL_COMMAND_DISCONNECT | (int)ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
            command.header.channelID = 0xFF;
            command.disconnect.data  = ENET_HOST_TO_NET_32(data);

            enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);
            enet_host_flush(peer->host);
        }

        enet_peer_reset(peer);
    }